

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExpressionParser::acceptTag(TagExpressionParser *this,string *tag)

{
  long in_RDI;
  Tag local_38;
  
  Tag::Tag(&local_38,(string *)(in_RDI + 0x10),SUB81((ulong)in_RDI >> 0x38,0));
  TagSet::add((TagSet *)this,(Tag *)tag);
  Tag::~Tag((Tag *)0x18036a);
  *(undefined1 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

virtual void acceptTag( std::string const& tag ) {
            m_currentTagSet.add( Tag( tag, m_isNegated ) );
            m_isNegated = false;
        }